

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b12_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  long lVar5;
  undefined1 in_XMM0 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint16_t uVar10;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  uint16_t uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  puVar4 = mask + mask_stride;
  auVar6 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      lVar5 = 0;
      do {
        uVar2 = *(ulong *)(mask + lVar5);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar2;
        uVar3 = *(undefined8 *)(puVar4 + lVar5);
        auVar8[0] = pavgb((char)uVar3,(char)uVar2);
        auVar8[1] = pavgb((char)((ulong)uVar3 >> 8),(char)(uVar2 >> 8));
        auVar8[2] = pavgb((char)((ulong)uVar3 >> 0x10),(char)(uVar2 >> 0x10));
        auVar8[3] = pavgb((char)((ulong)uVar3 >> 0x18),(char)(uVar2 >> 0x18));
        auVar8[4] = pavgb((char)((ulong)uVar3 >> 0x20),(char)(uVar2 >> 0x20));
        auVar8[5] = pavgb((char)((ulong)uVar3 >> 0x28),(char)(uVar2 >> 0x28));
        auVar8[6] = pavgb((char)((ulong)uVar3 >> 0x30),(char)(uVar2 >> 0x30));
        auVar8[7] = pavgb((char)((ulong)uVar3 >> 0x38),(char)(uVar2 >> 0x38));
        auVar8[8] = pavgb(0,0);
        auVar8[9] = pavgb(0,0);
        auVar8[10] = pavgb(0,0);
        auVar8[0xb] = pavgb(0,0);
        auVar8[0xc] = pavgb(0,0);
        auVar8[0xd] = pavgb(0,0);
        auVar8[0xe] = pavgb(0,0);
        auVar8[0xf] = pavgb(0,0);
        auVar8 = pmovzxbw(auVar7,auVar8);
        auVar7 = *(undefined1 (*) [16])(src0 + lVar5);
        puVar1 = src1 + lVar5;
        auVar28._0_12_ = auVar8._0_12_;
        auVar28._12_2_ = auVar8._6_2_;
        auVar28._14_2_ = auVar6._6_2_ - auVar8._6_2_;
        auVar27._12_4_ = auVar28._12_4_;
        auVar27._0_10_ = auVar8._0_10_;
        auVar27._10_2_ = auVar6._4_2_ - auVar8._4_2_;
        auVar26._10_6_ = auVar27._10_6_;
        auVar26._0_8_ = auVar8._0_8_;
        auVar26._8_2_ = auVar8._4_2_;
        auVar25._8_8_ = auVar26._8_8_;
        auVar25._6_2_ = auVar6._2_2_ - auVar8._2_2_;
        auVar25._4_2_ = auVar8._2_2_;
        auVar25._2_2_ = auVar6._0_2_ - auVar8._0_2_;
        auVar25._0_2_ = auVar8._0_2_;
        auVar9._2_2_ = auVar6._8_2_ - auVar8._8_2_;
        auVar9._0_2_ = auVar8._8_2_;
        auVar9._4_2_ = auVar8._10_2_;
        auVar9._6_2_ = auVar6._10_2_ - auVar8._10_2_;
        auVar9._8_2_ = auVar8._12_2_;
        auVar9._10_2_ = auVar6._12_2_ - auVar8._12_2_;
        auVar9._12_2_ = auVar8._14_2_;
        auVar9._14_2_ = auVar6._14_2_ - auVar8._14_2_;
        auVar14._0_12_ = auVar7._0_12_;
        auVar14._12_2_ = auVar7._6_2_;
        auVar14._14_2_ = puVar1[3];
        auVar13._12_4_ = auVar14._12_4_;
        auVar13._0_10_ = auVar7._0_10_;
        auVar13._10_2_ = puVar1[2];
        auVar12._10_6_ = auVar13._10_6_;
        auVar12._0_8_ = auVar7._0_8_;
        auVar12._8_2_ = auVar7._4_2_;
        auVar11._8_8_ = auVar12._8_8_;
        auVar11._6_2_ = puVar1[1];
        auVar11._4_2_ = auVar7._2_2_;
        auVar11._0_2_ = auVar7._0_2_;
        auVar11._2_2_ = *puVar1;
        auVar8 = pmaddwd(auVar11,auVar25);
        auVar23._2_2_ = puVar1[4];
        auVar23._0_2_ = auVar7._8_2_;
        auVar23._4_2_ = auVar7._10_2_;
        auVar23._6_2_ = puVar1[5];
        auVar23._8_2_ = auVar7._12_2_;
        auVar23._10_2_ = puVar1[6];
        auVar23._12_2_ = auVar7._14_2_;
        auVar23._14_2_ = puVar1[7];
        auVar7 = pmaddwd(auVar23,auVar9);
        auVar15._0_4_ = auVar8._0_4_ >> 5;
        auVar15._4_4_ = auVar8._4_4_ >> 5;
        auVar15._8_4_ = auVar8._8_4_ >> 5;
        auVar15._12_4_ = auVar8._12_4_ >> 5;
        auVar24._0_4_ = auVar7._0_4_ >> 5;
        auVar24._4_4_ = auVar7._4_4_ >> 5;
        auVar24._8_4_ = auVar7._8_4_ >> 5;
        auVar24._12_4_ = auVar7._12_4_ >> 5;
        auVar7 = packssdw(auVar15,auVar24);
        uVar10 = pavgw(auVar7._0_2_,0);
        uVar16 = pavgw(auVar7._2_2_,0);
        uVar17 = pavgw(auVar7._4_2_,0);
        uVar18 = pavgw(auVar7._6_2_,0);
        uVar19 = pavgw(auVar7._8_2_,0);
        uVar20 = pavgw(auVar7._10_2_,0);
        uVar21 = pavgw(auVar7._12_2_,0);
        uVar22 = pavgw(auVar7._14_2_,0);
        puVar1 = dst + lVar5;
        *puVar1 = uVar10;
        puVar1[1] = uVar16;
        puVar1[2] = uVar17;
        puVar1[3] = uVar18;
        puVar1[4] = uVar19;
        puVar1[5] = uVar20;
        puVar1[6] = uVar21;
        puVar1[7] = uVar22;
        lVar5 = lVar5 + 8;
      } while ((int)lVar5 < w);
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    puVar4 = puVar4 + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h,
                                  blend_8_b12);
}